

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifdef(bifcxdef *ctx,int argc)

{
  objnum obj;
  prpnum prop;
  runsdef *prVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  runcxdef *prVar5;
  undefined4 uVar6;
  bool bVar7;
  objnum def_objn;
  runsdef val;
  objnum local_2a;
  runsdef local_28;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  prVar5 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\x02') {
    prVar5->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  prVar1 = prVar5->runcxsp;
  obj = (prVar1->runsv).runsvobj;
  prVar5->runcxsp = prVar1 + -1;
  prVar5 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\r') {
    prVar5->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f4);
  }
  prVar1 = prVar5->runcxsp;
  prop = (prVar1->runsv).runsvprp;
  uVar6 = 1;
  if (argc == 3) {
    prVar5->runcxsp = prVar1 + -1;
    if (prVar1[-1].runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    uVar6 = *(undefined4 *)&ctx->bifcxrun->runcxsp->runsv;
  }
  uVar2 = objgetap(ctx->bifcxrun->runcxmem,obj,prop,&local_2a,0);
  switch(uVar6) {
  case 1:
    prVar5 = ctx->bifcxrun;
    iVar4 = (uint)(uVar2 != 0) * 3;
    goto LAB_001254be;
  case 2:
    prVar5 = ctx->bifcxrun;
    bVar7 = local_2a == obj;
    break;
  case 3:
    prVar5 = ctx->bifcxrun;
    bVar7 = local_2a != obj;
    break;
  case 4:
    if (uVar2 != 0) {
      runpobj(ctx->bifcxrun,local_2a);
      return;
    }
    runpnil(ctx->bifcxrun);
    return;
  default:
    ctx->bifcxrun->runcxerr->errcxptr->erraav[0].errastr = "defined";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x400);
  }
  bVar3 = bVar7 & uVar2 != 0;
  iVar4 = (uint)bVar3 + (uint)bVar3 * 2;
LAB_001254be:
  runpush(prVar5,iVar4 + 5,&local_28);
  return;
}

Assistant:

void bifdef(bifcxdef *ctx, int argc)
{
    prpnum  prpn;
    objnum  objn;
    uint    ofs;
    runsdef val;
    objnum  def_objn;
    int     flag;

    /* get object and property arguments */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);

    /* if there's a flag argument, get it as well */
    if (argc == 3)
    {
        /* get the flag */
        flag = (int)runpopnum(ctx->bifcxrun);
    }
    else
    {
        /* check the argument count */
        bifcntargs(ctx, 2, argc);

        /* use the default flag value (DEFINES_OR_INHERITS) */
        flag = BIFDEF_DEFINED_ANY;
    }

    /* get the offset of the property and the defining object */
    ofs = objgetap(ctx->bifcxrun->runcxmem, objn, prpn, &def_objn, FALSE);

    /* determine the type of information they want */
    switch(flag)
    {
    case BIFDEF_DEFINED_ANY:
        /* if the property is defined, return true, else return nil */
        runpush(ctx->bifcxrun, runclog(ofs != 0), &val);
        break;

    case BIFDEF_DEFINED_DIRECTLY:
        /* if the property is defined directly by the object, return true */
        runpush(ctx->bifcxrun, runclog(ofs != 0 && def_objn == objn), &val);
        break;
        
    case BIFDEF_DEFINED_INHERITS:
        /* if the property is inherited, return true */
        runpush(ctx->bifcxrun, runclog(ofs != 0 && def_objn != objn), &val);
        break;

    case BIFDEF_DEFINED_GET_CLASS:
        /* if it's defined, return the defining object, otherwise nil */
        if (ofs == 0)
            runpnil(ctx->bifcxrun);
        else
            runpobj(ctx->bifcxrun, def_objn);
        break;

    default:
        /* invalid flag value */
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "defined");
    }
}